

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O2

void __thiscall EmmyFacade::~EmmyFacade(EmmyFacade *this)

{
  EmmyDebuggerManager::~EmmyDebuggerManager(&this->_emmyDebuggerManager);
  std::
  _Rb_tree<lua_State_*,_lua_State_*,_std::_Identity<lua_State_*>,_std::less<lua_State_*>,_std::allocator<lua_State_*>_>
  ::~_Rb_tree(&(this->mainStates)._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::condition_variable::~condition_variable(&this->waitIDECV);
  std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

EmmyFacade::~EmmyFacade() {
}